

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor *
ggml_custom_inplace(ggml_context *ctx,ggml_tensor *a,ggml_tensor **args,int n_args,
                   ggml_custom_op_t fun,int n_tasks,void *userdata)

{
  ggml_tensor *pgVar1;
  int in_ECX;
  long in_RDX;
  ggml_tensor *in_RSI;
  ggml_tensor *in_R8;
  int i;
  ggml_custom_op_params params;
  ggml_tensor *result;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int iVar2;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  ggml_context *in_stack_ffffffffffffffc0;
  
  if (8 < in_ECX) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x13d2,"GGML_ASSERT(%s) failed","n_args < GGML_MAX_SRC - 1");
  }
  pgVar1 = ggml_view_tensor(in_stack_ffffffffffffffc0,
                            (ggml_tensor *)
                            CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  ggml_set_op_params(in_R8,(void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     0x153fe2);
  pgVar1->op = GGML_OP_CUSTOM;
  pgVar1->src[0] = in_RSI;
  for (iVar2 = 0; iVar2 < in_ECX; iVar2 = iVar2 + 1) {
    pgVar1->src[iVar2 + 1] = *(ggml_tensor **)(in_RDX + (long)iVar2 * 8);
  }
  return pgVar1;
}

Assistant:

struct ggml_tensor * ggml_custom_inplace(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor ** args,
        int                   n_args,
        ggml_custom_op_t      fun,
        int                   n_tasks,
        void                * userdata) {

    GGML_ASSERT(n_args < GGML_MAX_SRC - 1);

    struct ggml_tensor * result = ggml_view_tensor(ctx, a);

    struct ggml_custom_op_params params = {
        /*.fun      =*/ fun,
        /*.n_tasks  =*/ n_tasks,
        /*.userdata =*/ userdata
    };
    ggml_set_op_params(result, &params, sizeof(params));

    result->op = GGML_OP_CUSTOM;
    result->src[0] = a;
    for (int i = 0; i < n_args; i++) {
        result->src[i + 1] = args[i];
    }

    return result;
}